

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O0

size_t effect_get_menu_name(char *buf,size_t max,effect *e)

{
  char *fmt_00;
  obj_property *poVar1;
  char *pcVar2;
  wchar_t local_a8;
  wchar_t local_a4;
  uint local_8c;
  char local_88 [4];
  int avg_1;
  char dist [32];
  undefined1 local_5c [8];
  random_value value;
  int avg;
  char *actarg;
  char *actstr;
  size_t len;
  char *fmt;
  effect *e_local;
  size_t max_local;
  char *buf_local;
  
  if (((e == (effect *)0x0) || (e->index == 0)) || (0x7f < e->index)) {
    buf_local = (char *)0x0;
  }
  else {
    fmt_00 = base_descs[e->index].menu_name;
    switch(base_descs[e->index].efinfo_flag) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 0xb:
      actstr = (char *)strnfmt(buf,max,"%s",fmt_00);
      break;
    case 4:
      switch(e->subtype) {
      case L'\0':
        actarg = "feed";
        stack0xffffffffffffffb8 = "yourself";
        break;
      case L'\x01':
        actarg = "increase";
        stack0xffffffffffffffb8 = "hunger";
        break;
      case L'\x02':
        if (e->dice == (dice_t *)0x0) {
          local_a4 = L'\0';
        }
        else {
          local_a4 = dice_evaluate(e->dice,1,AVERAGE,(random_value *)0x0);
        }
        value.sides = local_a4;
        actarg = "become";
        if (PY_FOOD_FULL < local_a4) {
          stack0xffffffffffffffb8 = "bloated";
        }
        else if (PY_FOOD_HUNGRY < local_a4) {
          stack0xffffffffffffffb8 = "satisfied";
        }
        else {
          stack0xffffffffffffffb8 = "hungry";
        }
        break;
      case L'\x03':
        if (e->dice == (dice_t *)0x0) {
          local_a8 = L'\0';
        }
        else {
          local_a8 = dice_evaluate(e->dice,1,AVERAGE,(random_value *)0x0);
        }
        value.sides = local_a8;
        actarg = "leave";
        if (PY_FOOD_FULL < local_a8) {
          stack0xffffffffffffffb8 = "bloated";
        }
        else if (PY_FOOD_HUNGRY < local_a8) {
          stack0xffffffffffffffb8 = "nourished";
        }
        else {
          stack0xffffffffffffffb8 = "hungry";
        }
        break;
      default:
        actarg = (char *)0x0;
        stack0xffffffffffffffb8 = (char *)0x0;
      }
      if ((actarg == (char *)0x0) || (stack0xffffffffffffffb8 == (char *)0x0)) {
        actstr = (char *)strnfmt(buf,max,"%s","");
      }
      else {
        actstr = (char *)strnfmt(buf,max,fmt_00,actarg,stack0xffffffffffffffb8);
      }
      break;
    case 5:
    case 6:
      actstr = (char *)strnfmt(buf,max,fmt_00,timed_effects[e->subtype].desc);
      break;
    case 7:
      poVar1 = lookup_obj_property(L'\x01',e->subtype);
      actstr = (char *)strnfmt(buf,max,fmt_00,poVar1->name);
      break;
    case 8:
    case 0x11:
    case 0x12:
    case 0x13:
      actstr = (char *)strnfmt(buf,max,fmt_00,projections[e->subtype].desc);
      break;
    case 9:
      pcVar2 = summon_desc(e->subtype);
      actstr = (char *)strnfmt(buf,max,fmt_00,pcVar2);
      break;
    case 10:
      memset(local_5c,0,0x10);
      local_8c = 0;
      if (e->dice != (dice_t *)0x0) {
        local_8c = dice_evaluate(e->dice,1,AVERAGE,(random_value *)local_5c);
      }
      if (value.dice == 0) {
        strnfmt(local_88,0x20,"%d grids",(ulong)local_8c);
      }
      else {
        strnfmt(local_88,0x20,"some distance");
      }
      pcVar2 = "you";
      if (e->subtype != L'\0') {
        pcVar2 = "other";
      }
      actstr = (char *)strnfmt(buf,max,fmt_00,pcVar2,local_88);
      break;
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
      actstr = (char *)strnfmt(buf,max,fmt_00,projections[e->subtype].player_desc);
      break;
    case 0x10:
      actstr = (char *)strnfmt(buf,max,fmt_00,projections[e->subtype].lash_desc);
      break;
    default:
      actstr = (char *)strnfmt(buf,max,"%s","");
      msg("Bad effect description passed to effect_get_menu_name().  Please report this bug.");
    }
    buf_local = actstr;
  }
  return (size_t)buf_local;
}

Assistant:

size_t effect_get_menu_name(char *buf, size_t max, const struct effect *e)
{
	const char *fmt;
	size_t len;

	if (!e || e->index <= EF_NONE || e->index >= EF_MAX) {
		return 0;
	}

	fmt = base_descs[e->index].menu_name;
	switch (base_descs[e->index].efinfo_flag) {
	case EFINFO_DICE:
	case EFINFO_HEAL:
	case EFINFO_CONST:
	case EFINFO_QUAKE:
	case EFINFO_NONE:
		len = strnfmt(buf, max, "%s", fmt);
		break;

	case EFINFO_FOOD:
		{
			const char *actstr;
			const char *actarg;
			int avg;

			switch (e->subtype) {
			case 0: /* INC_BY */
				actstr = "feed";
				actarg = "yourself";
				break;
			case 1: /* DEC_BY */
				actstr = "increase";
				actarg = "hunger";
				break;
			case 2: /* SET_TO */
				avg = (e->dice) ?
					dice_evaluate(e->dice, 1, AVERAGE, NULL) : 0;
				actstr = "become";
				if (avg > PY_FOOD_FULL) {
					actarg = "bloated";
				} else if (avg > PY_FOOD_HUNGRY) {
					actarg = "satisfied";
				} else {
					actarg = "hungry";
				}
				break;
			case 3: /* INC_TO */
				avg = (e->dice) ?
					dice_evaluate(e->dice, 1, AVERAGE, NULL): 0;
				actstr = "leave";
				if (avg > PY_FOOD_FULL) {
					actarg = "bloated";
				} else if (avg > PY_FOOD_HUNGRY) {
					actarg = "nourished";
				} else {
					actarg = "hungry";
				}
				break;
			default:
				actstr = NULL;
				actarg = NULL;
				break;
			}
			if (actstr && actarg) {
				len = strnfmt(buf, max, fmt, actstr, actarg);
			} else {
				len = strnfmt(buf, max, "%s", "");
			}
		}
		break;

	case EFINFO_CURE:
	case EFINFO_TIMED:
		len = strnfmt(buf, max, fmt, timed_effects[e->subtype].desc);
		break;

	case EFINFO_STAT:
		len = strnfmt(buf, max, fmt,
			lookup_obj_property(OBJ_PROPERTY_STAT,
			e->subtype)->name);
		break;

	case EFINFO_SEEN:
	case EFINFO_BOLT:
	case EFINFO_BOLTD:
	case EFINFO_TOUCH:
		len = strnfmt(buf, max, fmt, projections[e->subtype].desc);
		break;

	case EFINFO_SUMM:
		len = strnfmt(buf, max, fmt, summon_desc(e->subtype));
		break;

	case EFINFO_TELE:
		{
			random_value value = { 0, 0, 0, 0 };
			char dist[32];
			int avg = 0;

			if (e->dice) {
				avg = dice_evaluate(e->dice, 1, AVERAGE,
					&value);
			}
			if (value.m_bonus) {
				strnfmt(dist, sizeof(dist), "some distance");
			} else {
				strnfmt(dist, sizeof(dist), "%d grids", avg);
			}
			len = strnfmt(buf, max, fmt,
				(e->subtype) ? "other" : "you", dist);
		}
		break;

	case EFINFO_BALL:
	case EFINFO_SPOT:
	case EFINFO_BREATH:
	case EFINFO_SHORT:
		len = strnfmt(buf, max, fmt,
			projections[e->subtype].player_desc);
		break;

	case EFINFO_LASH:
		len = strnfmt(buf, max, fmt, projections[e->subtype].lash_desc);
		break;

	default:
		len = strnfmt(buf, max, "%s", "");
		msg("Bad effect description passed to effect_get_menu_name().  Please report this bug.");
		break;
	}

	return len;
}